

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O3

void __thiscall
sznet::net::SelectPoller::fillActiveChannels
          (SelectPoller *this,int numEvents,ChannelList *activeChannels)

{
  _Rb_tree_header *p_Var1;
  pointer *pppCVar2;
  int iVar3;
  iterator __position;
  Channel *in_RAX;
  _Base_ptr p_Var4;
  pointer pEVar5;
  uint uVar6;
  int iVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  uint uVar10;
  pointer pEVar11;
  bool bVar12;
  Channel *local_38;
  Channel *channel;
  
  pEVar11 = (this->m_pollfds).
            super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar5 = (this->m_pollfds).
           super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < numEvents && pEVar11 != pEVar5) {
    p_Var1 = &(this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header;
    local_38 = in_RAX;
    do {
      iVar3 = pEVar11->fd;
      iVar7 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar7 = iVar3;
      }
      iVar7 = iVar7 >> 6;
      uVar9 = (ulong)(uint)(iVar3 % 0x40);
      bVar12 = ((ulong)(this->m_rfds).fds_bits[iVar7] >> (uVar9 & 0x3f) & 1) != 0;
      uVar10 = bVar12 + 8;
      if (((ulong)(this->m_wfds).fds_bits[iVar7] >> (uVar9 & 0x3f) & 1) == 0) {
        uVar10 = (uint)bVar12;
      }
      uVar6 = uVar10 + 0x10;
      if (((ulong)(this->m_efds).fds_bits[iVar7] >> (uVar9 & 0x3f) & 1) == 0) {
        uVar6 = uVar10;
      }
      if (uVar6 != 0) {
        p_Var8 = (this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
        if (p_Var8 == (_Base_ptr)0x0) {
LAB_00111f34:
          __assert_fail("ch != m_channels.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                        ,100,
                        "void sznet::net::SelectPoller::fillActiveChannels(int, ChannelList *) const"
                       );
        }
        numEvents = numEvents + -1;
        p_Var4 = &p_Var1->_M_header;
        do {
          if (iVar3 <= (int)*(size_t *)(p_Var8 + 1)) {
            p_Var4 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < iVar3];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var4 == p_Var1) ||
           (iVar3 < (int)((_Rb_tree_header *)p_Var4)->_M_node_count)) goto LAB_00111f34;
        local_38 = *(Channel **)((long)p_Var4 + 0x28);
        if (local_38->m_fd != iVar3) {
          __assert_fail("channel->fd() == it->fd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                        ,0x66,
                        "void sznet::net::SelectPoller::fillActiveChannels(int, ChannelList *) const"
                       );
        }
        local_38->m_revents = uVar6;
        __position._M_current =
             (activeChannels->
             super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (activeChannels->
            super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<sznet::net::Channel*,std::allocator<sznet::net::Channel*>>::
          _M_realloc_insert<sznet::net::Channel*const&>
                    ((vector<sznet::net::Channel*,std::allocator<sznet::net::Channel*>> *)
                     activeChannels,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pppCVar2 = &(activeChannels->
                      super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar2 = *pppCVar2 + 1;
        }
        pEVar5 = (this->m_pollfds).
                 super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pEVar11 = pEVar11 + 1;
    } while ((pEVar11 != pEVar5) && (0 < numEvents));
  }
  return;
}

Assistant:

void SelectPoller::fillActiveChannels(int numEvents, ChannelList* activeChannels) const
{
	for (auto it = m_pollfds.begin(); it != m_pollfds.end() && numEvents > 0; ++it)
	{
		unsigned int revents = 0;
		if (FD_ISSET(it->fd, &m_rfds))
		{
			revents |= Channel::kReadEvent;
		}
		if (FD_ISSET(it->fd, &m_wfds))
		{
			revents |= Channel::kWriteEvent;
		}
		if (FD_ISSET(it->fd, &m_efds))
		{
			revents |= Channel::kErrorEvent;
		}
		if (revents > 0)
		{
			--numEvents;
			ChannelMap::const_iterator ch = m_channels.find(it->fd);
			assert(ch != m_channels.end());
			Channel* channel = ch->second;
			assert(channel->fd() == it->fd);
			channel->set_revents(revents);
			activeChannels->push_back(channel);
		}
	}
}